

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase41::run(TestCase41 *this)

{
  bool bVar1;
  uint64_t uVar2;
  anon_class_8_1_6b0526df *extraout_RDX;
  anon_class_8_1_6b0526df *extraout_RDX_00;
  anon_class_8_1_6b0526df *extraout_RDX_01;
  anon_class_8_1_6b0526df *extraout_RDX_02;
  anon_class_8_1_6b0526df *extraout_RDX_03;
  anon_class_8_1_6b0526df *paVar3;
  anon_class_8_1_6b0526df *extraout_RDX_04;
  anon_class_8_1_6b0526df *func;
  bool local_1e69;
  undefined1 auStack_1e68 [7];
  bool _kj_shouldLog_21;
  Maybe<capnp::StructSchema::Field> local_1e58;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_1e10;
  undefined1 local_1dc8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_23;
  undefined1 auStack_1d58 [7];
  bool _kj_shouldLog_20;
  Maybe<capnp::StructSchema::Field> local_1d48;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_1d00;
  undefined1 local_1cb8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_22;
  undefined1 auStack_1c48 [7];
  bool _kj_shouldLog_19;
  Maybe<capnp::StructSchema::Field> local_1c38;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_1bf0;
  undefined1 local_1ba8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_21;
  undefined1 auStack_1b38 [7];
  bool _kj_shouldLog_18;
  Maybe<capnp::StructSchema::Field> local_1b28;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_1ae0;
  undefined1 local_1a98 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_20;
  undefined1 auStack_1a28 [7];
  bool _kj_shouldLog_17;
  Maybe<capnp::StructSchema::Field> local_1a18;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_19d0;
  undefined1 local_1988 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_19;
  undefined1 auStack_1918 [7];
  bool _kj_shouldLog_16;
  Maybe<capnp::StructSchema::Field> local_1908;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_18c0;
  undefined1 local_1878 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_18;
  undefined1 auStack_1808 [7];
  bool _kj_shouldLog_15;
  Schema local_17f8;
  Field local_17f0;
  Reader local_17b0;
  Reader local_1780;
  bool local_174b;
  DebugExpression<bool> local_174a;
  bool local_1749;
  undefined1 auStack_1748 [6];
  DebugExpression<bool> _kjCondition_17;
  bool _kj_shouldLog_14;
  Field local_1738;
  Reader local_16f8;
  Reader local_16c8;
  bool local_1693;
  DebugExpression<bool> local_1692;
  bool local_1691;
  undefined1 local_1690 [6];
  DebugExpression<bool> _kjCondition_16;
  bool _kj_shouldLog_13;
  Reader local_1660;
  bool local_162b;
  DebugExpression<bool> local_162a;
  bool local_1629;
  undefined1 local_1628 [6];
  DebugExpression<bool> _kjCondition_15;
  bool _kj_shouldLog_12;
  Field local_15f0;
  Field *local_15b0;
  undefined1 local_15a8 [8];
  DebugComparison<capnp::StructSchema::Field_&,_capnp::StructSchema::Field> _kjCondition_14;
  DebugExpression<capnp::StructSchema::Field_&> DStack_1540;
  bool _kj_shouldLog_11;
  undefined1 local_1538 [8];
  DebugComparison<capnp::StructSchema::Field_&,_capnp::StructSchema::Field_&> _kjCondition_13;
  undefined1 local_1500 [8];
  Field lookup;
  Schema SStack_14b8;
  bool _kj_shouldLog_10;
  StructSchema local_14b0;
  undefined1 local_14a8 [8];
  DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> _kjCondition_12;
  ArrayPtr<const_char> local_1450;
  bool local_1439;
  undefined1 local_1438 [7];
  bool _kj_shouldLog_9;
  ArrayPtr<const_char> local_1408;
  char (*local_13f8) [10];
  undefined1 local_13f0 [8];
  DebugComparison<const_char_(&)[10],_capnp::Text::Reader> _kjCondition_11;
  undefined1 local_1388 [8];
  Field field;
  Reader local_1318;
  Reader local_12e8;
  uint local_12b4;
  FieldList local_12b0;
  uint local_1274;
  Fault local_1270;
  Fault f_1;
  Reader local_1238;
  Reader local_1208;
  uint local_11d4;
  FieldList local_11d0;
  uint local_1198;
  DebugExpression<unsigned_int> local_1194;
  undefined1 local_1190 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_10;
  Fault local_1160;
  Fault f;
  char (*local_1148) [13];
  undefined1 local_1140 [8];
  DebugComparison<const_char_(&)[13],_const_kj::StringPtr> _kjCondition_9;
  undefined1 auStack_1108 [7];
  bool _kj_shouldLog_8;
  Maybe<kj::Exception> local_1100;
  DebugExpression<kj::Maybe<kj::Exception>_> local_f68;
  undefined1 local_dd0 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_8;
  undefined1 auStack_c10 [7];
  bool _kj_shouldLog_7;
  Maybe<kj::Exception> local_c08;
  DebugExpression<kj::Maybe<kj::Exception>_> local_a70;
  undefined1 local_8d8 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_7;
  Schema SStack_718;
  bool _kj_shouldLog_6;
  StructSchema local_710;
  undefined1 local_708 [8];
  DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> _kjCondition_6;
  bool _kj_shouldLog_5;
  undefined1 local_6d0 [416];
  DebugExpression<kj::Maybe<kj::Exception>_> local_530;
  undefined1 local_398 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_5;
  Schema SStack_1d8;
  bool _kj_shouldLog_4;
  Schema local_1d0;
  undefined1 local_1c8 [8];
  DebugComparison<capnp::Schema,_capnp::StructSchema_&> _kjCondition_4;
  Schema SStack_198;
  bool _kj_shouldLog_3;
  Schema local_190;
  Schema local_188;
  undefined1 local_180 [8];
  DebugComparison<capnp::Schema,_capnp::StructSchema> _kjCondition_3;
  Schema SStack_150;
  bool _kj_shouldLog_2;
  Schema local_148;
  undefined1 local_140 [8];
  DebugComparison<capnp::Schema,_capnp::StructSchema_&> _kjCondition_2;
  Schema SStack_110;
  bool _kj_shouldLog_1;
  Schema local_108;
  Schema local_100;
  undefined1 local_f8 [8];
  DebugComparison<capnp::Schema,_capnp::EnumSchema> _kjCondition_1;
  Array<unsigned_char> *local_a0;
  class_kj__Own_72 local_98;
  bool local_89;
  undefined1 local_88 [7];
  bool _kj_shouldLog;
  uint64_t local_58;
  uint64_t local_50;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  StructSchema schema;
  TestCase41 *this_local;
  
  _kjCondition._32_8_ = Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  local_50 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                       ();
  local_48 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50);
  Schema::getProto((Reader *)local_88,(Schema *)&_kjCondition.result);
  local_58 = capnp::schema::Node::Reader::getId((Reader *)local_88);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_40,&local_48,&local_58);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    local_89 = kj::_::Debug::shouldLog(ERROR);
    while (local_89 != false) {
      local_98.PointerType =
           (void *)typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                             ();
      Schema::getProto((Reader *)&_kjCondition_1.result,(Schema *)&_kjCondition.result);
      local_a0 = (Array<unsigned_char> *)
                 capnp::schema::Node::Reader::getId((Reader *)&_kjCondition_1.result);
      kj::_::Debug::
      log<char_const(&)[73],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x2c,ERROR,
                 "\"failed: expected \" \"(typeId<TestAllTypes>()) == (schema.getProto().getId())\", _kjCondition, typeId<TestAllTypes>(), schema.getProto().getId()"
                 ,(char (*) [73])
                  "failed: expected (typeId<TestAllTypes>()) == (schema.getProto().getId())",
                 (DebugComparison<unsigned_long,_unsigned_long> *)local_40,
                 (unsigned_long *)&local_98,(unsigned_long *)&local_a0);
      local_89 = false;
    }
  }
  uVar2 = typeId<capnp::schemas::TestEnum_9c8e9318b29d9cd3,11281115850894843091ul>();
  local_108 = Schema::getDependency((Schema *)&_kjCondition.result,uVar2);
  local_100.raw =
       (RawBrandedSchema *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_108);
  SStack_110.raw = (RawBrandedSchema *)Schema::from<capnp::schemas::TestEnum_9c8e9318b29d9cd3>();
  kj::_::DebugExpression<capnp::Schema>::operator==
            ((DebugComparison<capnp::Schema,_capnp::EnumSchema> *)local_f8,
             (DebugExpression<capnp::Schema> *)&local_100,(EnumSchema *)&stack0xfffffffffffffef0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[86],kj::_::DebugComparison<capnp::Schema,capnp::EnumSchema>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x2e,ERROR,
                 "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()\", _kjCondition"
                 ,(char (*) [86])
                  "failed: expected schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>()"
                 ,(DebugComparison<capnp::Schema,_capnp::EnumSchema> *)local_f8);
      _kjCondition_2._39_1_ = 0;
    }
  }
  uVar2 = typeId<capnp::schemas::TestEnum_9c8e9318b29d9cd3,11281115850894843091ul>();
  SStack_150 = Schema::getDependency((Schema *)&_kjCondition.result,uVar2);
  local_148.raw =
       (RawBrandedSchema *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffeb0);
  kj::_::DebugExpression<capnp::Schema>::operator!=
            ((DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)local_140,
             (DebugExpression<capnp::Schema> *)&local_148,(StructSchema *)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
  if (!bVar1) {
    _kjCondition_3._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[68],kj::_::DebugComparison<capnp::Schema,capnp::StructSchema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x2f,ERROR,
                 "\"failed: expected \" \"schema.getDependency(typeId<TestEnum>()) != schema\", _kjCondition"
                 ,(char (*) [68])
                  "failed: expected schema.getDependency(typeId<TestEnum>()) != schema",
                 (DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)local_140);
      _kjCondition_3._39_1_ = 0;
    }
  }
  uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  local_190 = Schema::getDependency((Schema *)&_kjCondition.result,uVar2);
  local_188.raw =
       (RawBrandedSchema *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_190);
  SStack_198.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  kj::_::DebugExpression<capnp::Schema>::operator==
            ((DebugComparison<capnp::Schema,_capnp::StructSchema> *)local_180,
             (DebugExpression<capnp::Schema> *)&local_188,(StructSchema *)&stack0xfffffffffffffe68);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[94],kj::_::DebugComparison<capnp::Schema,capnp::StructSchema>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x30,ERROR,
                 "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()\", _kjCondition"
                 ,(char (*) [94])
                  "failed: expected schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>()"
                 ,(DebugComparison<capnp::Schema,_capnp::StructSchema> *)local_180);
      _kjCondition_4._39_1_ = 0;
    }
  }
  uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  SStack_1d8 = Schema::getDependency((Schema *)&_kjCondition.result,uVar2);
  local_1d0.raw =
       (RawBrandedSchema *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe28);
  kj::_::DebugExpression<capnp::Schema>::operator==
            ((DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)local_1c8,
             (DebugExpression<capnp::Schema> *)&local_1d0,(StructSchema *)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c8);
  paVar3 = extraout_RDX;
  if (!bVar1) {
    _kjCondition_5._439_1_ = kj::_::Debug::shouldLog(ERROR);
    paVar3 = extraout_RDX_00;
    while (_kjCondition_5._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[72],kj::_::DebugComparison<capnp::Schema,capnp::StructSchema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x31,ERROR,
                 "\"failed: expected \" \"schema.getDependency(typeId<TestAllTypes>()) == schema\", _kjCondition"
                 ,(char (*) [72])
                  "failed: expected schema.getDependency(typeId<TestAllTypes>()) == schema",
                 (DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)local_1c8);
      paVar3 = extraout_RDX_01;
      _kjCondition_5._439_1_ = 0;
    }
  }
  local_6d0._0_8_ = &_kjCondition.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase41::run()::__0>
            ((Maybe<kj::Exception> *)(local_6d0 + 8),(kj *)local_6d0,paVar3);
  kj::_::DebugExpressionStart::operator<<
            (&local_530,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
             (Maybe<kj::Exception> *)(local_6d0 + 8));
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_398,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_530,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_530);
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_6d0 + 8));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_398);
  if (!bVar1) {
    _kjCondition_6._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._35_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[112],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x32,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != kj::none\", _kjCondition"
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestDefaults>()); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_398);
      _kjCondition_6._35_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_398);
  SStack_718.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&_kjCondition.result);
  local_710.super_Schema.raw =
       (Schema)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (StructSchema *)&stack0xfffffffffffff8e8);
  kj::_::DebugExpression<capnp::StructSchema>::operator==
            ((DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_708,
             (DebugExpression<capnp::StructSchema> *)&local_710,(StructSchema *)&_kjCondition.result
            );
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_708);
  paVar3 = extraout_RDX_02;
  if (!bVar1) {
    _kjCondition_7._439_1_ = kj::_::Debug::shouldLog(ERROR);
    paVar3 = extraout_RDX_03;
    while (_kjCondition_7._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x34,ERROR,"\"failed: expected \" \"schema.asStruct() == schema\", _kjCondition",
                 (char (*) [45])"failed: expected schema.asStruct() == schema",
                 (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_708);
      paVar3 = extraout_RDX_04;
      _kjCondition_7._439_1_ = 0;
    }
  }
  _auStack_c10 = &_kjCondition.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase41::run()::__1>
            (&local_c08,(kj *)auStack_c10,paVar3);
  kj::_::DebugExpressionStart::operator<<
            (&local_a70,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c08);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_8d8,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_a70,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_a70);
  kj::Maybe<kj::Exception>::~Maybe(&local_c08);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8d8);
  if (!bVar1) {
    _kjCondition_8._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x35,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asEnum(); }) != kj::none\", _kjCondition"
                 ,(char (*) [83])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.asEnum(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_8d8);
      _kjCondition_8._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_8d8);
  _auStack_1108 = &_kjCondition.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase41::run()::__2>
            (&local_1100,(kj *)auStack_1108,func);
  kj::_::DebugExpressionStart::operator<<
            (&local_f68,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1100);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_dd0,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_f68,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_f68);
  kj::Maybe<kj::Exception>::~Maybe(&local_1100);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_dd0);
  if (!bVar1) {
    _kjCondition_9._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_9._47_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[88],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x36,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asInterface(); }) != kj::none\", _kjCondition"
                 ,(char (*) [88])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.asInterface(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_dd0);
      _kjCondition_9._47_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_dd0);
  local_1148 = (char (*) [13])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x9e41c5);
  _f = (ArrayPtr<const_char>)Schema::getUnqualifiedName((Schema *)&_kjCondition.result);
  kj::_::DebugExpression<char_const(&)[13]>::operator==
            ((DebugComparison<const_char_(&)[13],_const_kj::StringPtr> *)local_1140,
             (DebugExpression<char_const(&)[13]> *)&local_1148,(StringPtr *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1140);
  if (bVar1) {
    StructSchema::getFields(&local_11d0,(StructSchema *)&_kjCondition.result);
    local_1198 = StructSchema::FieldList::size(&local_11d0);
    local_1194 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1198);
    Schema::getProto((Reader *)&f_1,(Schema *)&_kjCondition.result);
    capnp::schema::Node::Reader::getStruct(&local_1238,(Reader *)&f_1);
    capnp::schema::Node::Struct::Reader::getFields(&local_1208,&local_1238);
    local_11d4 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size(&local_1208);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_int> *)local_1190,&local_1194,&local_11d4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1190);
    if (bVar1) {
      StructSchema::getFields
                ((FieldList *)&_kjCondition_11.result,(StructSchema *)&_kjCondition.result);
      StructSchema::FieldList::operator[]
                ((Field *)local_1388,(FieldList *)&_kjCondition_11.result,0);
      local_13f8 = (char (*) [10])
                   kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                              (char (*) [10])"voidField");
      StructSchema::Field::getProto((Reader *)local_1438,(Field *)local_1388);
      local_1408 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_1438)
      ;
      kj::_::DebugExpression<char_const(&)[10]>::operator==
                ((DebugComparison<const_char_(&)[10],_capnp::Text::Reader> *)local_13f0,
                 (DebugExpression<char_const(&)[10]> *)&local_13f8,(Reader *)&local_1408);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_13f0);
      if (!bVar1) {
        local_1439 = kj::_::Debug::shouldLog(ERROR);
        while (local_1439 != false) {
          StructSchema::Field::getProto((Reader *)&_kjCondition_12.result,(Field *)local_1388);
          local_1450 = (ArrayPtr<const_char>)
                       capnp::schema::Field::Reader::getName((Reader *)&_kjCondition_12.result);
          kj::_::Debug::
          log<char_const(&)[63],kj::_::DebugComparison<char_const(&)[10],capnp::Text::Reader>&,char_const(&)[10],capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x3b,ERROR,
                     "\"failed: expected \" \"(\\\"voidField\\\") == (field.getProto().getName())\", _kjCondition, \"voidField\", field.getProto().getName()"
                     ,(char (*) [63])
                      "failed: expected (\"voidField\") == (field.getProto().getName())",
                     (DebugComparison<const_char_(&)[10],_capnp::Text::Reader> *)local_13f0,
                     (char (*) [10])"voidField",(Reader *)&local_1450);
          local_1439 = false;
        }
      }
      SStack_14b8.raw =
           (RawBrandedSchema *)StructSchema::Field::getContainingStruct((Field *)local_1388);
      local_14b0.super_Schema.raw =
           (Schema)kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                              (StructSchema *)&stack0xffffffffffffeb48);
      kj::_::DebugExpression<capnp::StructSchema>::operator==
                ((DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_14a8,
                 (DebugExpression<capnp::StructSchema> *)&local_14b0,
                 (StructSchema *)&_kjCondition.result);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14a8);
      if (!bVar1) {
        lookup.proto._reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
        while (lookup.proto._reader._47_1_ != '\0') {
          kj::_::Debug::
          log<char_const(&)[55],kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x3c,ERROR,
                     "\"failed: expected \" \"field.getContainingStruct() == schema\", _kjCondition"
                     ,(char (*) [55])"failed: expected field.getContainingStruct() == schema",
                     (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_14a8);
          lookup.proto._reader._47_1_ = 0;
        }
      }
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_13.result,"voidField");
      StructSchema::getFieldByName
                ((Field *)local_1500,(StructSchema *)&_kjCondition.result,
                 (StringPtr)stack0xffffffffffffeaf0);
      DStack_1540 = kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Field *)local_1500);
      kj::_::DebugExpression<capnp::StructSchema::Field&>::operator==
                ((DebugComparison<capnp::StructSchema::Field_&,_capnp::StructSchema::Field_&> *)
                 local_1538,(DebugExpression<capnp::StructSchema::Field&> *)&stack0xffffffffffffeac0
                 ,(Field *)local_1388);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1538);
      if (!bVar1) {
        _kjCondition_14._95_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_14._95_1_ != '\0') {
          kj::_::Debug::
          log<char_const(&)[33],kj::_::DebugComparison<capnp::StructSchema::Field&,capnp::StructSchema::Field&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x3f,ERROR,"\"failed: expected \" \"lookup == field\", _kjCondition",
                     (char (*) [33])"failed: expected lookup == field",
                     (DebugComparison<capnp::StructSchema::Field_&,_capnp::StructSchema::Field_&> *)
                     local_1538);
          _kjCondition_14._95_1_ = 0;
        }
      }
      local_15b0 = (Field *)kj::_::DebugExpressionStart::operator<<
                                      ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                       (Field *)local_1500);
      StructSchema::getFields((FieldList *)local_1628,(StructSchema *)&_kjCondition.result);
      StructSchema::FieldList::operator[](&local_15f0,(FieldList *)local_1628,1);
      kj::_::DebugExpression<capnp::StructSchema::Field&>::operator!=
                ((DebugComparison<capnp::StructSchema::Field_&,_capnp::StructSchema::Field> *)
                 local_15a8,(DebugExpression<capnp::StructSchema::Field&> *)&local_15b0,&local_15f0)
      ;
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_15a8);
      if (!bVar1) {
        local_1629 = kj::_::Debug::shouldLog(ERROR);
        while (local_1629 != false) {
          kj::_::Debug::
          log<char_const(&)[49],kj::_::DebugComparison<capnp::StructSchema::Field&,capnp::StructSchema::Field>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x40,ERROR,
                     "\"failed: expected \" \"lookup != schema.getFields()[1]\", _kjCondition",
                     (char (*) [49])"failed: expected lookup != schema.getFields()[1]",
                     (DebugComparison<capnp::StructSchema::Field_&,_capnp::StructSchema::Field> *)
                     local_15a8);
          local_1629 = false;
        }
      }
      StructSchema::Field::getProto((Reader *)local_1690,(Field *)local_1500);
      capnp::schema::Field::Reader::getSlot(&local_1660,(Reader *)local_1690);
      bVar1 = capnp::schema::Field::Slot::Reader::getHadExplicitDefault(&local_1660);
      local_162b = (bool)((bVar1 ^ 0xffU) & 1);
      local_162a = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_162b);
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_162a);
      if (!bVar1) {
        local_1691 = kj::_::Debug::shouldLog(ERROR);
        while (local_1691 != false) {
          kj::_::Debug::log<char_const(&)[72],kj::_::DebugExpression<bool>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x41,ERROR,
                     "\"failed: expected \" \"!(lookup.getProto().getSlot().getHadExplicitDefault())\", _kjCondition"
                     ,(char (*) [72])
                      "failed: expected !(lookup.getProto().getSlot().getHadExplicitDefault())",
                     &local_162a);
          local_1691 = false;
        }
      }
      kj::StringPtr::StringPtr((StringPtr *)auStack_1748,"int32Field");
      StructSchema::getFieldByName
                (&local_1738,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_1748);
      StructSchema::Field::getProto(&local_16f8,&local_1738);
      capnp::schema::Field::Reader::getSlot(&local_16c8,&local_16f8);
      bVar1 = capnp::schema::Field::Slot::Reader::getHadExplicitDefault(&local_16c8);
      local_1693 = (bool)((bVar1 ^ 0xffU) & 1);
      local_1692 = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1693);
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1692);
      if (!bVar1) {
        local_1749 = kj::_::Debug::shouldLog(ERROR);
        while (local_1749 != false) {
          kj::_::Debug::log<char_const(&)[101],kj::_::DebugExpression<bool>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x43,ERROR,
                     "\"failed: expected \" \"!(schema.getFieldByName(\\\"int32Field\\\").getProto().getSlot().getHadExplicitDefault())\", _kjCondition"
                     ,(char (*) [101])
                      "failed: expected !(schema.getFieldByName(\"int32Field\").getProto().getSlot().getHadExplicitDefault())"
                     ,&local_1692);
          local_1749 = false;
        }
      }
      local_17f8.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestDefaults>()
      ;
      kj::StringPtr::StringPtr((StringPtr *)auStack_1808,"int32Field");
      StructSchema::getFieldByName(&local_17f0,(StructSchema *)&local_17f8,(StringPtr)_auStack_1808)
      ;
      StructSchema::Field::getProto(&local_17b0,&local_17f0);
      capnp::schema::Field::Reader::getSlot(&local_1780,&local_17b0);
      local_174b = capnp::schema::Field::Slot::Reader::getHadExplicitDefault(&local_1780);
      local_174a = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_174b);
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_174a);
      if (!bVar1) {
        _kjCondition_18._103_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_18._103_1_ != '\0') {
          kj::_::Debug::log<char_const(&)[121],kj::_::DebugExpression<bool>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x46,ERROR,
                     "\"failed: expected \" \"Schema::from<TestDefaults>().getFieldByName(\\\"int32Field\\\") .getProto().getSlot().getHadExplicitDefault()\", _kjCondition"
                     ,(char (*) [121])
                      "failed: expected Schema::from<TestDefaults>().getFieldByName(\"int32Field\") .getProto().getSlot().getHadExplicitDefault()"
                     ,&local_174a);
          _kjCondition_18._103_1_ = 0;
        }
      }
      kj::StringPtr::StringPtr((StringPtr *)auStack_1918,"noSuchField");
      StructSchema::findFieldByName
                (&local_1908,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_1918);
      kj::_::DebugExpressionStart::operator<<
                (&local_18c0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1908);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
                ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_1878,(DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_18c0,
                 (None *)&kj::none);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_18c0);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_1908);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1878);
      if (!bVar1) {
        _kjCondition_19._103_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_19._103_1_ != '\0') {
          kj::_::Debug::
          log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x48,ERROR,
                     "\"failed: expected \" \"schema.findFieldByName(\\\"noSuchField\\\") == kj::none\", _kjCondition"
                     ,(char (*) [67])
                      "failed: expected schema.findFieldByName(\"noSuchField\") == kj::none",
                     (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                     local_1878);
          _kjCondition_19._103_1_ = 0;
        }
      }
      kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::
      ~DebugComparison((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                       local_1878);
      kj::StringPtr::StringPtr((StringPtr *)auStack_1a28,"int32Field");
      StructSchema::findFieldByName
                (&local_1a18,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_1a28);
      kj::_::DebugExpressionStart::operator<<
                (&local_19d0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a18);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
                ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_1988,(DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_19d0,
                 (None *)&kj::none);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_19d0);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_1a18);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1988);
      if (!bVar1) {
        _kjCondition_20._103_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_20._103_1_ != '\0') {
          kj::_::Debug::
          log<char_const(&)[66],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x4a,ERROR,
                     "\"failed: expected \" \"schema.findFieldByName(\\\"int32Field\\\") != kj::none\", _kjCondition"
                     ,(char (*) [66])
                      "failed: expected schema.findFieldByName(\"int32Field\") != kj::none",
                     (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                     local_1988);
          _kjCondition_20._103_1_ = 0;
        }
      }
      kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::
      ~DebugComparison((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                       local_1988);
      kj::StringPtr::StringPtr((StringPtr *)auStack_1b38,"float32List");
      StructSchema::findFieldByName
                (&local_1b28,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_1b38);
      kj::_::DebugExpressionStart::operator<<
                (&local_1ae0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1b28);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
                ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_1a98,(DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_1ae0,
                 (None *)&kj::none);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_1ae0);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_1b28);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a98);
      if (!bVar1) {
        _kjCondition_21._103_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_21._103_1_ != '\0') {
          kj::_::Debug::
          log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x4b,ERROR,
                     "\"failed: expected \" \"schema.findFieldByName(\\\"float32List\\\") != kj::none\", _kjCondition"
                     ,(char (*) [67])
                      "failed: expected schema.findFieldByName(\"float32List\") != kj::none",
                     (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                     local_1a98);
          _kjCondition_21._103_1_ = 0;
        }
      }
      kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::
      ~DebugComparison((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                       local_1a98);
      kj::StringPtr::StringPtr((StringPtr *)auStack_1c48,"dataList");
      StructSchema::findFieldByName
                (&local_1c38,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_1c48);
      kj::_::DebugExpressionStart::operator<<
                (&local_1bf0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1c38);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
                ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_1ba8,(DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_1bf0,
                 (None *)&kj::none);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_1bf0);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_1c38);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1ba8);
      if (!bVar1) {
        _kjCondition_22._103_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_22._103_1_ != '\0') {
          kj::_::Debug::
          log<char_const(&)[64],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x4c,ERROR,
                     "\"failed: expected \" \"schema.findFieldByName(\\\"dataList\\\") != kj::none\", _kjCondition"
                     ,(char (*) [64])
                      "failed: expected schema.findFieldByName(\"dataList\") != kj::none",
                     (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                     local_1ba8);
          _kjCondition_22._103_1_ = 0;
        }
      }
      kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::
      ~DebugComparison((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                       local_1ba8);
      kj::StringPtr::StringPtr((StringPtr *)auStack_1d58,"textField");
      StructSchema::findFieldByName
                (&local_1d48,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_1d58);
      kj::_::DebugExpressionStart::operator<<
                (&local_1d00,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1d48);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
                ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_1cb8,(DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_1d00,
                 (None *)&kj::none);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_1d00);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_1d48);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1cb8);
      if (!bVar1) {
        _kjCondition_23._103_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_23._103_1_ != '\0') {
          kj::_::Debug::
          log<char_const(&)[65],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x4d,ERROR,
                     "\"failed: expected \" \"schema.findFieldByName(\\\"textField\\\") != kj::none\", _kjCondition"
                     ,(char (*) [65])
                      "failed: expected schema.findFieldByName(\"textField\") != kj::none",
                     (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                     local_1cb8);
          _kjCondition_23._103_1_ = 0;
        }
      }
      kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::
      ~DebugComparison((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                       local_1cb8);
      kj::StringPtr::StringPtr((StringPtr *)auStack_1e68,"structField");
      StructSchema::findFieldByName
                (&local_1e58,(StructSchema *)&_kjCondition.result,(StringPtr)_auStack_1e68);
      kj::_::DebugExpressionStart::operator<<
                (&local_1e10,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1e58);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
                ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_1dc8,(DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_1e10,
                 (None *)&kj::none);
      kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_1e10);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_1e58);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1dc8);
      if (!bVar1) {
        local_1e69 = kj::_::Debug::shouldLog(ERROR);
        while (local_1e69 != false) {
          kj::_::Debug::
          log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                     ,0x4e,ERROR,
                     "\"failed: expected \" \"schema.findFieldByName(\\\"structField\\\") != kj::none\", _kjCondition"
                     ,(char (*) [67])
                      "failed: expected schema.findFieldByName(\"structField\") != kj::none",
                     (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                     local_1dc8);
          local_1e69 = false;
        }
      }
      kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::
      ~DebugComparison((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                       local_1dc8);
      return;
    }
    StructSchema::getFields(&local_12b0,(StructSchema *)&_kjCondition.result);
    local_1274 = StructSchema::FieldList::size(&local_12b0);
    Schema::getProto((Reader *)&field.proto._reader.nestingLimit,(Schema *)&_kjCondition.result);
    capnp::schema::Node::Reader::getStruct(&local_1318,(Reader *)&field.proto._reader.nestingLimit);
    capnp::schema::Node::Struct::Reader::getFields(&local_12e8,&local_1318);
    local_12b4 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size(&local_12e8);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_1270,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x39,FAILED,
               "(schema.getFields().size()) == (schema.getProto().getStruct().getFields().size())",
               "_kjCondition,schema.getFields().size(), schema.getProto().getStruct().getFields().size()"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)local_1190,&local_1274,&local_12b4);
    kj::_::Debug::Fault::fatal(&local_1270);
  }
  join_0x00000010_0x00000000_ =
       (ArrayPtr<const_char>)Schema::getUnqualifiedName((Schema *)&_kjCondition.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<char_const(&)[13],kj::StringPtr_const>&,char_const(&)[13],kj::StringPtr_const>
            (&local_1160,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
             ,0x37,FAILED,"(\"TestAllTypes\") == (schema.getUnqualifiedName())",
             "_kjCondition,\"TestAllTypes\", schema.getUnqualifiedName()",
             (DebugComparison<const_char_(&)[13],_const_kj::StringPtr> *)local_1140,
             (char (*) [13])0x9e41c5,(StringPtr *)&_kjCondition_10.result);
  kj::_::Debug::Fault::fatal(&local_1160);
}

Assistant:

TEST(Schema, Structs) {
  StructSchema schema = Schema::from<TestAllTypes>();

  EXPECT_EQ(typeId<TestAllTypes>(), schema.getProto().getId());

  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) == Schema::from<TestEnum>());
  EXPECT_TRUE(schema.getDependency(typeId<TestEnum>()) != schema);
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == Schema::from<TestAllTypes>());
  EXPECT_TRUE(schema.getDependency(typeId<TestAllTypes>()) == schema);
  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestDefaults>()));

  EXPECT_TRUE(schema.asStruct() == schema);
  EXPECT_NONFATAL_FAILURE(schema.asEnum());
  EXPECT_NONFATAL_FAILURE(schema.asInterface());
  ASSERT_EQ("TestAllTypes", schema.getUnqualifiedName());

  ASSERT_EQ(schema.getFields().size(), schema.getProto().getStruct().getFields().size());
  StructSchema::Field field = schema.getFields()[0];
  EXPECT_EQ("voidField", field.getProto().getName());
  EXPECT_TRUE(field.getContainingStruct() == schema);

  StructSchema::Field lookup = schema.getFieldByName("voidField");
  EXPECT_TRUE(lookup == field);
  EXPECT_TRUE(lookup != schema.getFields()[1]);
  EXPECT_FALSE(lookup.getProto().getSlot().getHadExplicitDefault());

  EXPECT_FALSE(schema.getFieldByName("int32Field").getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(Schema::from<TestDefaults>().getFieldByName("int32Field")
      .getProto().getSlot().getHadExplicitDefault());

  EXPECT_TRUE(schema.findFieldByName("noSuchField") == kj::none);

  EXPECT_TRUE(schema.findFieldByName("int32Field") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("float32List") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("dataList") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("textField") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("structField") != kj::none);
}